

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O2

void __thiscall
slang::syntax::SyntaxVisitor<PublicDirectiveVisitor>::
visitDefault<slang::syntax::DeferredAssertionSyntax_const&>
          (SyntaxVisitor<PublicDirectiveVisitor> *this,DeferredAssertionSyntax *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  uint uVar2;
  ulong index;
  Token token;
  
  uVar2 = 0;
  while( true ) {
    index = (ulong)uVar2;
    sVar1 = SyntaxNode::getChildCount(&node->super_SyntaxNode);
    if (sVar1 <= index) break;
    node_00 = SyntaxNode::childNode(&node->super_SyntaxNode,index);
    if (node_00 == (SyntaxNode *)0x0) {
      token = SyntaxNode::childToken(&node->super_SyntaxNode,index);
      if (token.info != (Info *)0x0) {
        PublicDirectiveVisitor::visitToken((PublicDirectiveVisitor *)this,token);
      }
    }
    else {
      detail::visitSyntaxNode<slang::syntax::SyntaxNode_const,PublicDirectiveVisitor>
                (node_00,(PublicDirectiveVisitor *)this);
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }